

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

optional<supermap::KeyValue<char,_char>_> __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void,_char>::find
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void,_char> *this,
          char *pattern,function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *less,
          function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *equal)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  KeyValue<char,_char> middleElem;
  KeyValue<char,_char> firstLeqElem;
  
  uVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
            super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
            super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage[1])
                    ();
  uVar5 = 0;
  if (uVar3 != 0) {
    uVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage
              [1])(this);
    while (uVar8 = uVar5, uVar6 = uVar3, 1 < (int)(uVar6 - uVar8)) {
      uVar1 = (long)(int)(uVar8 + uVar6) / 2;
      uVar7 = (uint)uVar1;
      iVar4 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
                super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
                super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage
                [4])(this,uVar1 & 0xffffffff,(long)(int)(uVar8 + uVar6) % 2 & 0xffffffff);
      middleElem = SUB42(iVar4,0);
      bVar2 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::operator()
                        (less,&middleElem,pattern);
      uVar3 = uVar6;
      uVar5 = uVar7;
      if ((!bVar2) &&
         (bVar2 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::
                  operator()(equal,&middleElem,pattern), uVar3 = uVar7, uVar5 = uVar8, bVar2)) {
        uVar3 = uVar6;
        uVar5 = uVar7;
      }
    }
    uVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage
              [1])(this);
    if ((int)uVar8 < (int)uVar3) {
      iVar4 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>).
                super_IndexedStorage<supermap::KeyValue<char,_char>,_int,_void>.
                super_OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>._vptr_OrderedStorage
                [4])(this,(ulong)uVar8);
      firstLeqElem = SUB42(iVar4,0);
      bVar2 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::operator()
                        (equal,&firstLeqElem,pattern);
      uVar5 = (uint)bVar2;
      uVar3 = (uint)(ushort)firstLeqElem;
    }
    else {
      uVar5 = 0;
    }
  }
  return (_Optional_base<supermap::KeyValue<char,_char>,_true,_true>)
         ((uint3)uVar3 & 0xffff | (uint3)(uVar5 << 0x10));
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }